

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compress(void *dst,size_t dstCapacity,void *src,size_t srcSize,int compressionLevel)

{
  ZSTD_customMem memManager;
  undefined1 local_4c0 [8];
  ZSTD_CCtx ctxBody;
  size_t result;
  int compressionLevel_local;
  size_t srcSize_local;
  void *src_local;
  size_t dstCapacity_local;
  void *dst_local;
  
  memManager.opaque = (void *)0x0;
  memManager.customAlloc = (ZSTD_allocFunction)0x0;
  memManager.customFree = (ZSTD_freeFunction)0x0;
  ZSTD_initCCtx((ZSTD_CCtx *)local_4c0,memManager);
  ctxBody.mtctx =
       (ZSTDMT_CCtx *)
       ZSTD_compressCCtx((ZSTD_CCtx *)local_4c0,dst,dstCapacity,src,srcSize,compressionLevel);
  ZSTD_freeCCtxContent((ZSTD_CCtx *)local_4c0);
  return (size_t)ctxBody.mtctx;
}

Assistant:

size_t ZSTD_compress(void* dst, size_t dstCapacity,
               const void* src, size_t srcSize,
                     int compressionLevel)
{
    size_t result;
    ZSTD_CCtx ctxBody;
    ZSTD_initCCtx(&ctxBody, ZSTD_defaultCMem);
    result = ZSTD_compressCCtx(&ctxBody, dst, dstCapacity, src, srcSize, compressionLevel);
    ZSTD_freeCCtxContent(&ctxBody);   /* can't free ctxBody itself, as it's on stack; free only heap content */
    return result;
}